

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# galloping_lower_bound.cpp
# Opt level: O0

void test<std::vector<long,std::allocator<long>>,__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>(*)(__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>,long_const&)>
               (vector<long,_std::allocator<long>_> *numbers,size_t attempts,
               _func___normal_iterator<const_long_ptr,_std::vector<long,_std::allocator<long>_>_>___normal_iterator<const_long_ptr,_std::vector<long,_std::allocator<long>_>_>___normal_iterator<const_long_ptr,_std::vector<long,_std::allocator<long>_>_>_long_ptr
               *lower_bound,string *name)

{
  long lVar1;
  size_type sVar2;
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> _Var3;
  difference_type __x;
  reference plVar4;
  clock_t cVar5;
  const_iterator cVar6;
  clock_t cVar7;
  ostream *poVar8;
  __type _Var9;
  undefined1 auVar10 [16];
  clock_t attempt_time;
  long number;
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> search_element;
  size_t search_position;
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> local_40;
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> search_start;
  size_t attempt;
  clock_t total_time;
  string *name_local;
  _func___normal_iterator<const_long_ptr,_std::vector<long,_std::allocator<long>_>_>___normal_iterator<const_long_ptr,_std::vector<long,_std::allocator<long>_>_>___normal_iterator<const_long_ptr,_std::vector<long,_std::allocator<long>_>_>_long_ptr
  *lower_bound_local;
  size_t attempts_local;
  vector<long,_std::allocator<long>_> *numbers_local;
  
  attempt = 0;
  for (search_start._M_current = (long *)0x0; search_start._M_current < attempts;
      search_start._M_current = search_start._M_current + 1) {
    search_position = (size_t)std::vector<long,_std::allocator<long>_>::begin(numbers);
    lVar1 = random();
    sVar2 = std::vector<long,_std::allocator<long>_>::size(numbers);
    _Var3 = __gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>::
            operator+((__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> *)
                      &search_position,lVar1 % (long)(sVar2 - 1));
    local_40 = _Var3;
    search_element._M_current = (long *)std::vector<long,_std::allocator<long>_>::end(numbers);
    __x = std::
          distance<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>>
                    (_Var3,search_element);
    _Var9 = std::sqrt<long>(__x);
    lVar1 = random();
    number = (long)__gnu_cxx::
                   __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>::
                   operator+(&local_40,
                             lVar1 % ((long)_Var9 |
                                     (long)(_Var9 - 9.223372036854776e+18) & (long)_Var9 >> 0x3f));
    plVar4 = __gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>::
             operator*((__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> *
                       )&number);
    attempt_time = *plVar4;
    cVar5 = clock();
    _Var3._M_current = local_40._M_current;
    cVar6 = std::vector<long,_std::allocator<long>_>::end(numbers);
    (*lower_bound)((__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>)
                   _Var3._M_current,
                   (__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>)
                   cVar6._M_current,&attempt_time);
    cVar7 = clock();
    attempt = (cVar7 - cVar5) + attempt;
  }
  poVar8 = std::operator<<((ostream *)&std::cout,(string *)name);
  poVar8 = std::operator<<(poVar8,":");
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  poVar8 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_1036a);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(double)(long)attempt / 1000000.0);
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  poVar8 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_10380);
  auVar10._8_4_ = (int)(attempts >> 0x20);
  auVar10._0_8_ = attempts;
  auVar10._12_4_ = 0x45300000;
  poVar8 = (ostream *)
           std::ostream::operator<<
                     (poVar8,((double)(long)attempt /
                             ((auVar10._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)attempts) - 4503599627370496.0))) /
                             1000000.0);
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void test (const Container & numbers, std::size_t attempts, Function lower_bound, const std::string & name)
{
    clock_t total_time = 0;

    for (std::size_t attempt = 0; attempt < attempts; ++attempt)
    {
        using difference_type = typename Container::difference_type;
        auto search_start = numbers.begin() + random() % static_cast<difference_type>(numbers.size() - 1);
        auto search_position = static_cast<std::size_t>(std::sqrt(std::distance(search_start, numbers.end())));
        auto search_element = search_start + random() % static_cast<difference_type>(search_position);
        auto number = *search_element;

        clock_t attempt_time = clock();
        lower_bound(search_start, numbers.end(), number);
        attempt_time = clock() - attempt_time;
        total_time += attempt_time;
    }

    std::cout << name << ":" << std::endl;
    std::cout << "\tОбщее время: " << static_cast<double>(total_time) / CLOCKS_PER_SEC << std::endl;
    std::cout << "\tСреднее время: " << static_cast<double>(total_time) / static_cast<double>(attempts) / CLOCKS_PER_SEC << std::endl;
    std::cout << std::endl;
}